

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O1

int Bac_BoxCountOutputs(Bac_Ntk_t *pNtk,char *pBoxNtk)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = Abc_NamStrFind(pNtk->pDesign->pMods,pBoxNtk);
  if (uVar1 == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = pNtk->pDesign->pNtks[uVar1].vOutputs.nCap;
  }
  return iVar2;
}

Assistant:

int Bac_BoxCountOutputs( Bac_Ntk_t * pNtk, char * pBoxNtk )
{
    int ModuleId = Bac_ManNtkFindId( pNtk->pDesign, pBoxNtk );
    if ( ModuleId == 0 )
        return 1;
    return Bac_NtkPoNumAlloc( Bac_ManNtk(pNtk->pDesign, ModuleId) );
}